

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int SSL_CTX_use_certificate_blob(SSL_CTX *ctx,curl_blob *blob,int type,char *key_passwd)

{
  BIO *bp;
  BIO *in;
  X509 *x;
  int ret;
  char *key_passwd_local;
  int type_local;
  curl_blob *blob_local;
  SSL_CTX *ctx_local;
  
  in = (BIO *)0x0;
  bp = BIO_new_mem_buf(blob->data,(int)blob->len);
  if (bp == (BIO *)0x0) {
    return 0x1b;
  }
  if (type == 2) {
    in = (BIO *)d2i_X509_bio(bp,(X509 **)0x0);
  }
  else {
    if (type != 1) {
      x._4_4_ = 0;
      goto LAB_001b5a8b;
    }
    in = (BIO *)PEM_read_bio_X509(bp,(X509 **)0x0,passwd_callback,key_passwd);
  }
  if (in == (BIO *)0x0) {
    x._4_4_ = 0;
  }
  else {
    x._4_4_ = SSL_CTX_use_certificate((SSL_CTX *)ctx,(X509 *)in);
  }
LAB_001b5a8b:
  X509_free((X509 *)in);
  BIO_free(bp);
  return x._4_4_;
}

Assistant:

static int
SSL_CTX_use_certificate_blob(SSL_CTX *ctx, const struct curl_blob *blob,
                             int type, const char *key_passwd)
{
  int ret = 0;
  X509 *x = NULL;
  /* the typecast of blob->len is fine since it is guaranteed to never be
     larger than CURL_MAX_INPUT_LENGTH */
  BIO *in = BIO_new_mem_buf(blob->data, (int)(blob->len));
  if(!in)
    return CURLE_OUT_OF_MEMORY;

  if(type == SSL_FILETYPE_ASN1) {
    /* j = ERR_R_ASN1_LIB; */
    x = d2i_X509_bio(in, NULL);
  }
  else if(type == SSL_FILETYPE_PEM) {
    /* ERR_R_PEM_LIB; */
    x = PEM_read_bio_X509(in, NULL,
                          passwd_callback, (void *)key_passwd);
  }
  else {
    ret = 0;
    goto end;
  }

  if(!x) {
    ret = 0;
    goto end;
  }

  ret = SSL_CTX_use_certificate(ctx, x);
end:
  X509_free(x);
  BIO_free(in);
  return ret;
}